

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  undefined8 uVar1;
  GLboolean GVar2;
  int iVar3;
  _GLFWwindow *window;
  _GLFWwindow *window_00;
  long lVar4;
  char *format;
  _GLFWlibrary *p_Var5;
  _GLFWfbconfig *p_Var6;
  _GLFWwndconfig wndconfig;
  int height_1;
  int width_1;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  _GLFWwndconfig local_c8;
  int local_a0;
  int local_9c;
  _GLFWctxconfig local_98;
  _GLFWfbconfig local_70;
  
  if (_glfwInitialized == '\0') {
    iVar3 = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (0 < width && 0 < height) {
      p_Var5 = &_glfw;
      p_Var6 = &local_70;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        iVar3 = (p_Var5->hints).framebuffer.greenBits;
        p_Var6->redBits = (p_Var5->hints).framebuffer.redBits;
        p_Var6->greenBits = iVar3;
        p_Var5 = (_GLFWlibrary *)&(p_Var5->hints).framebuffer.blueBits;
        p_Var6 = (_GLFWfbconfig *)&p_Var6->blueBits;
      }
      local_98._16_8_ = _glfw.hints.context._16_8_;
      local_98._24_8_ = _glfw.hints.context._24_8_;
      local_98._0_8_ = _glfw.hints.context._0_8_;
      local_98._8_8_ = _glfw.hints.context._8_8_;
      local_c8._16_8_ = _glfw.hints.window._16_8_;
      local_c8.height = height;
      local_c8.width = width;
      if (monitor != (GLFWmonitor *)0x0) {
        local_c8._18_6_ = _glfw.hints.window._18_6_;
        local_c8._16_2_ = 0x101;
        uVar1 = local_c8._16_8_;
        local_c8._20_4_ = _glfw.hints.window._20_4_;
        local_c8._16_3_ = SUB83(uVar1,0);
        local_c8.focused = '\x01';
      }
      local_c8.title = title;
      local_c8.monitor = (_GLFWmonitor *)monitor;
      local_98.share = (_GLFWwindow *)share;
      GVar2 = _glfwIsValidContextConfig(&local_98);
      if (GVar2 != '\0') {
        window = (_GLFWwindow *)calloc(1,0x2e0);
        window->next = _glfw.windowListHead;
        _glfw.windowListHead = window;
        (window->videoMode).width = width;
        (window->videoMode).height = height;
        (window->videoMode).redBits = local_70.redBits;
        (window->videoMode).greenBits = local_70.greenBits;
        (window->videoMode).blueBits = local_70.blueBits;
        (window->videoMode).refreshRate = _glfw.hints.refreshRate;
        window->monitor = local_c8.monitor;
        window->resizable = local_c8.resizable;
        window->decorated = local_c8.decorated;
        window->autoIconify = local_c8.autoIconify;
        window->floating = local_c8.floating;
        window->cursorMode = 0x34001;
        window_00 = _glfwPlatformGetCurrentContext();
        iVar3 = _glfwPlatformCreateWindow(window,&local_c8,&local_98,&local_70);
        if (iVar3 != 0) {
          _glfwPlatformMakeContextCurrent(window);
          GVar2 = _glfwRefreshContextAttribs(&local_98);
          if ((GVar2 != '\0') && (GVar2 = _glfwIsValidContext(&local_98), GVar2 != '\0')) {
            (*window->Clear)(0x4000);
            _glfwPlatformSwapBuffers(window);
            _glfwPlatformMakeContextCurrent(window_00);
            if (local_c8.monitor != (_GLFWmonitor *)0x0) {
              _glfwPlatformGetWindowSize(window,&local_9c,&local_a0);
              window->cursorPosX = (double)(local_9c / 2);
              window->cursorPosY = (double)(local_a0 / 2);
              _glfwPlatformSetCursorPos(window,(double)(local_9c / 2),(double)(local_a0 / 2));
              return (GLFWwindow *)window;
            }
            if (local_c8.visible == '\0') {
              return (GLFWwindow *)window;
            }
            if (local_c8.focused != '\0') {
              _glfwPlatformShowWindow(window);
              return (GLFWwindow *)window;
            }
            _glfwPlatformUnhideWindow(window);
            return (GLFWwindow *)window;
          }
        }
        glfwDestroyWindow((GLFWwindow *)window);
        _glfwPlatformMakeContextCurrent(window_00);
      }
      return (GLFWwindow *)0x0;
    }
    format = "Invalid window size";
    iVar3 = 0x10004;
  }
  _glfwInputError(iVar3,format);
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid window size");
        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    wndconfig.monitor = (_GLFWmonitor*) monitor;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (wndconfig.monitor)
    {
        wndconfig.resizable = GL_TRUE;
        wndconfig.visible   = GL_TRUE;
        wndconfig.focused   = GL_TRUE;
    }

    // Check the OpenGL bits of the window config
    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor     = wndconfig.monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    // Save the currently current context so it can be restored later
    previous = _glfwPlatformGetCurrentContext();

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    _glfwPlatformMakeContextCurrent(window);

    // Retrieve the actual (as opposed to requested) context attributes
    if (!_glfwRefreshContextAttribs(&ctxconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    // Verify the context against the requested parameters
    if (!_glfwIsValidContext(&ctxconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    // Clearing the front buffer to black to avoid garbage pixels left over
    // from previous uses of our bit of VRAM
    window->Clear(GL_COLOR_BUFFER_BIT);
    _glfwPlatformSwapBuffers(window);

    // Restore the previously current context (or NULL)
    _glfwPlatformMakeContextCurrent(previous);

    if (wndconfig.monitor)
    {
        int width, height;
        _glfwPlatformGetWindowSize(window, &width, &height);

        window->cursorPosX = width / 2;
        window->cursorPosY = height / 2;

        _glfwPlatformSetCursorPos(window, window->cursorPosX, window->cursorPosY);
    }
    else
    {
        if (wndconfig.visible)
        {
            if (wndconfig.focused)
                _glfwPlatformShowWindow(window);
            else
                _glfwPlatformUnhideWindow(window);
        }
    }

    return (GLFWwindow*) window;
}